

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O2

bool __thiscall zmq::zmtp_engine_t::handshake_v1_0_unversioned(zmtp_engine_t *this)

{
  msg_t *this_00;
  long lVar1;
  byte bVar2;
  i_encoder *piVar3;
  bool bVar4;
  int iVar5;
  v1_encoder_t *this_01;
  v1_decoder_t *this_02;
  void *__dest;
  undefined4 extraout_var;
  size_t bufsize_;
  uchar *bufferp;
  uchar tmp [10];
  
  bVar4 = session_base_t::zap_enabled((this->super_stream_engine_base_t)._session);
  if (bVar4) {
    stream_engine_base_t::error(&this->super_stream_engine_base_t,protocol_error);
  }
  else {
    this_01 = (v1_encoder_t *)operator_new(0x58,(nothrow_t *)&std::nothrow);
    if (this_01 == (v1_encoder_t *)0x0) {
      (this->super_stream_engine_base_t)._encoder = (i_encoder *)0x0;
      fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x106);
      fflush(_stderr);
      zmq_abort("FATAL ERROR: OUT OF MEMORY");
    }
    else {
      v1_encoder_t::v1_encoder_t
                (this_01,(long)(this->super_stream_engine_base_t)._options.out_batch_size);
      (this->super_stream_engine_base_t)._encoder = (i_encoder *)this_01;
    }
    this_02 = (v1_decoder_t *)operator_new(0x90,(nothrow_t *)&std::nothrow);
    if (this_02 == (v1_decoder_t *)0x0) {
      (this->super_stream_engine_base_t)._decoder = (i_decoder *)0x0;
      iVar5 = 0x1dfb0b;
      fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x10a);
      fflush(_stderr);
      zmq_abort("FATAL ERROR: OUT OF MEMORY");
    }
    else {
      bufsize_ = (size_t)(this->super_stream_engine_base_t)._options.in_batch_size;
      v1_decoder_t::v1_decoder_t
                (this_02,bufsize_,(this->super_stream_engine_base_t)._options.maxmsgsize);
      iVar5 = (int)bufsize_;
      (this->super_stream_engine_base_t)._decoder = (i_decoder *)this_02;
    }
    bVar2 = (this->super_stream_engine_base_t)._options.routing_id_size;
    bufferp = tmp;
    this_00 = &this->_routing_id_msg;
    iVar5 = msg_t::close(this_00,iVar5);
    if (iVar5 != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x117);
      fflush(_stderr);
      zmq_abort("rc == 0");
    }
    lVar1 = (ulong)(0xfd < bVar2) * 8 + 2;
    iVar5 = msg_t::init_size(this_00,(ulong)(this->super_stream_engine_base_t)._options.
                                            routing_id_size);
    if (iVar5 != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x119);
      fflush(_stderr);
      zmq_abort("rc == 0");
    }
    __dest = msg_t::data(this_00);
    memcpy(__dest,(this->super_stream_engine_base_t)._options.routing_id,
           (ulong)(this->super_stream_engine_base_t)._options.routing_id_size);
    piVar3 = (this->super_stream_engine_base_t)._encoder;
    (*piVar3->_vptr_i_encoder[3])(piVar3,this_00);
    piVar3 = (this->super_stream_engine_base_t)._encoder;
    iVar5 = (*piVar3->_vptr_i_encoder[2])(piVar3,&bufferp,lVar1);
    if (CONCAT44(extraout_var,iVar5) != lVar1) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","buffer_size == header_size",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x11e);
      fflush(_stderr);
      zmq_abort("buffer_size == header_size");
    }
    (this->super_stream_engine_base_t)._inpos = this->_greeting_recv;
    (this->super_stream_engine_base_t)._insize = (ulong)this->_greeting_bytes_read;
    if ((byte)((this->super_stream_engine_base_t)._options.type | 8U) == 9) {
      this->_subscription_required = true;
    }
    (this->super_stream_engine_base_t)._next_msg =
         (offset_in_stream_engine_base_t_to_subr)stream_engine_base_t::pull_msg_from_session;
    *(undefined8 *)&(this->super_stream_engine_base_t).field_0x550 = 0;
    (this->super_stream_engine_base_t)._process_msg =
         (offset_in_stream_engine_base_t_to_subr)process_routing_id_msg;
    *(undefined8 *)&(this->super_stream_engine_base_t).field_0x560 = 0;
  }
  return !bVar4;
}

Assistant:

bool zmq::zmtp_engine_t::handshake_v1_0_unversioned ()
{
    //  We send and receive rest of routing id message
    if (session ()->zap_enabled ()) {
        // reject ZMTP 1.0 connections if ZAP is enabled
        error (protocol_error);
        return false;
    }

    _encoder = new (std::nothrow) v1_encoder_t (_options.out_batch_size);
    alloc_assert (_encoder);

    _decoder = new (std::nothrow)
      v1_decoder_t (_options.in_batch_size, _options.maxmsgsize);
    alloc_assert (_decoder);

    //  We have already sent the message header.
    //  Since there is no way to tell the encoder to
    //  skip the message header, we simply throw that
    //  header data away.
    const size_t header_size =
      _options.routing_id_size + 1 >= UCHAR_MAX ? 10 : 2;
    unsigned char tmp[10], *bufferp = tmp;

    //  Prepare the routing id message and load it into encoder.
    //  Then consume bytes we have already sent to the peer.
    int rc = _routing_id_msg.close ();
    zmq_assert (rc == 0);
    rc = _routing_id_msg.init_size (_options.routing_id_size);
    zmq_assert (rc == 0);
    memcpy (_routing_id_msg.data (), _options.routing_id,
            _options.routing_id_size);
    _encoder->load_msg (&_routing_id_msg);
    const size_t buffer_size = _encoder->encode (&bufferp, header_size);
    zmq_assert (buffer_size == header_size);

    //  Make sure the decoder sees the data we have already received.
    _inpos = _greeting_recv;
    _insize = _greeting_bytes_read;

    //  To allow for interoperability with peers that do not forward
    //  their subscriptions, we inject a phantom subscription message
    //  message into the incoming message stream.
    if (_options.type == ZMQ_PUB || _options.type == ZMQ_XPUB)
        _subscription_required = true;

    //  We are sending our routing id now and the next message
    //  will come from the socket.
    _next_msg = &zmtp_engine_t::pull_msg_from_session;

    //  We are expecting routing id message.
    _process_msg = static_cast<int (stream_engine_base_t::*) (msg_t *)> (
      &zmtp_engine_t::process_routing_id_msg);

    return true;
}